

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void fill_variance_tree(void *data,BLOCK_SIZE bsize)

{
  BLOCK_SIZE in_SIL;
  void *in_RDI;
  variance_node node;
  VPVariance *in_stack_ffffffffffffffc8;
  VPartVar *in_stack_ffffffffffffffd0;
  
  memset(&stack0xffffffffffffffc8,0,0x28);
  tree_to_node(in_RDI,in_SIL,(variance_node *)&stack0xffffffffffffffc8);
  sum_2_variances(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->none,(VPartVar *)0x3780e8);
  sum_2_variances(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->none,(VPartVar *)0x378103);
  sum_2_variances(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->none,(VPartVar *)0x37811a);
  sum_2_variances(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->none,(VPartVar *)0x378135);
  sum_2_variances(in_stack_ffffffffffffffd0,&in_stack_ffffffffffffffc8->none,(VPartVar *)0x378152);
  return;
}

Assistant:

static inline void fill_variance_tree(void *data, BLOCK_SIZE bsize) {
  variance_node node;
  memset(&node, 0, sizeof(node));
  tree_to_node(data, bsize, &node);
  sum_2_variances(node.split[0], node.split[1], &node.part_variances->horz[0]);
  sum_2_variances(node.split[2], node.split[3], &node.part_variances->horz[1]);
  sum_2_variances(node.split[0], node.split[2], &node.part_variances->vert[0]);
  sum_2_variances(node.split[1], node.split[3], &node.part_variances->vert[1]);
  sum_2_variances(&node.part_variances->vert[0], &node.part_variances->vert[1],
                  &node.part_variances->none);
}